

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepairResponsePdu.cpp
# Opt level: O1

void __thiscall DIS::RepairResponsePdu::RepairResponsePdu(RepairResponsePdu *this)

{
  LogisticsFamilyPdu::LogisticsFamilyPdu(&this->super_LogisticsFamilyPdu);
  (this->super_LogisticsFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__RepairResponsePdu_001b5cb0;
  EntityID::EntityID(&this->_receivingEntityID);
  EntityID::EntityID(&this->_repairingEntityID);
  this->_repairResult = '\0';
  this->_padding1 = 0;
  this->_padding2 = '\0';
  PduSuperclass::setPduType((PduSuperclass *)this,'\n');
  return;
}

Assistant:

RepairResponsePdu::RepairResponsePdu() : LogisticsFamilyPdu(),
   _receivingEntityID(), 
   _repairingEntityID(), 
   _repairResult(0), 
   _padding1(0), 
   _padding2(0)
{
    setPduType( 10 );
}